

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_manual_hostkey.c
# Opt level: O1

_Bool validate_manual_hostkey(char *key)

{
  char cVar1;
  uint3 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  _Bool _Var9;
  uint uVar10;
  int iVar11;
  size_t sVar12;
  long lVar13;
  __int32_t **pp_Var14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *__s;
  char *__s_00;
  _Bool _Var18;
  uchar decoded [6];
  uchar local_3e [2];
  ushort local_3c;
  char *local_38;
  
  sVar12 = strspn(key," \t");
  _Var18 = key[sVar12] != '\0';
  if (!_Var18) {
    return _Var18;
  }
  __s_00 = key + sVar12;
  local_38 = key;
LAB_0016e855:
  sVar12 = strcspn(__s_00," \t");
  pcVar17 = __s_00 + sVar12;
  if (__s_00[sVar12] != '\0') {
    *pcVar17 = '\0';
    pcVar17 = pcVar17 + 1;
  }
  _Var9 = strstartswith(__s_00,"SHA256:");
  if ((_Var9) &&
     (sVar12 = strspn(__s_00 + 7,"0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ+/")
     , sVar12 == 0x2b)) {
    uVar3 = *(undefined8 *)__s_00;
    uVar4 = *(undefined8 *)(__s_00 + 8);
    uVar5 = *(undefined8 *)(__s_00 + 0x10);
    uVar6 = *(undefined8 *)(__s_00 + 0x18);
    uVar7 = *(undefined8 *)(__s_00 + 0x20);
    uVar8 = *(undefined8 *)(__s_00 + 0x28);
    *(undefined2 *)(local_38 + 0x30) = *(undefined2 *)(__s_00 + 0x30);
    *(undefined8 *)(local_38 + 0x20) = uVar7;
    *(undefined8 *)(local_38 + 0x28) = uVar8;
    *(undefined8 *)(local_38 + 0x10) = uVar5;
    *(undefined8 *)(local_38 + 0x18) = uVar6;
    *(undefined8 *)local_38 = uVar3;
    *(undefined8 *)(local_38 + 8) = uVar4;
    local_38[0x32] = '\0';
    return _Var18;
  }
  _Var9 = strstartswith(__s_00,"MD5:");
  __s = __s_00;
  if (_Var9) {
    __s = __s_00 + 4;
  }
  sVar12 = strlen(__s);
  pcVar15 = __s_00;
  pcVar16 = __s_00;
  if ((sVar12 == 0x2f) && (sVar12 = strspn(__s,"0123456789abcdefABCDEF:"), __s[sVar12] == '\0')) {
    lVar13 = 1;
    do {
      if ((__s[lVar13 + -1] == ':') || (__s[lVar13] == ':')) goto LAB_0016e935;
      lVar13 = lVar13 + 3;
    } while (lVar13 != 0x31);
    lVar13 = 2;
    while (__s[lVar13] == ':') {
      lVar13 = lVar13 + 3;
      if (lVar13 == 0x2f) {
        lVar13 = 0;
        pp_Var14 = __ctype_tolower_loc();
        do {
          local_38[lVar13] = (char)(*pp_Var14)[__s[lVar13]];
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x2f);
        local_38[0x2f] = '\0';
        return _Var18;
      }
    }
  }
LAB_0016e935:
  do {
    cVar1 = *pcVar16;
    if ((cVar1 != '\n') && (cVar1 != '\r')) {
      if (cVar1 == '\0') break;
      *pcVar15 = cVar1;
      pcVar15 = pcVar15 + 1;
    }
    pcVar16 = pcVar16 + 1;
  } while( true );
  *pcVar15 = '\0';
  sVar12 = strlen(__s_00);
  if ((((8 < sVar12 && (sVar12 & 3) == 0) &&
       (sVar12 = strspn(__s_00,"0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ+/="),
       __s_00[sVar12] == '\0')) && (uVar10 = base64_decode_atom(__s_00,local_3e), 2 < (int)uVar10))
     && (((iVar11 = base64_decode_atom(__s_00 + 4,local_3e + uVar10), 3 < (int)(iVar11 + uVar10) &&
          (uVar2 = CONCAT12(local_3e[1],local_3c << 8 | local_3c >> 8),
          CONCAT13(local_3e[0],uVar2) < 0x41)) &&
         (sVar12 = strlen(__s_00), (ulong)(uVar2 + 6) / 3 <= sVar12)))) {
    sVar12 = strspn(__s_00,"0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ+/=");
    pcVar17 = local_38;
    memmove(local_38,__s_00,sVar12);
    pcVar17[sVar12] = '\0';
    return _Var18;
  }
  sVar12 = strspn(pcVar17," \t");
  __s_00 = pcVar17 + sVar12;
  _Var18 = pcVar17[sVar12] != '\0';
  if (!_Var18) {
    return _Var18;
  }
  goto LAB_0016e855;
}

Assistant:

bool validate_manual_hostkey(char *key)
{
    char *p, *q, *r, *s;

    /*
     * Step through the string word by word, looking for a word that's
     * in one of the formats we like.
     */
    p = key;
    while ((p += strspn(p, " \t"))[0]) {
        q = p;
        p += strcspn(p, " \t");
        if (*p) *p++ = '\0';

        /*
         * Now q is our word.
         */

        if (strstartswith(q, "SHA256:")) {
            /* Test for a valid SHA256 key fingerprint. */
            r = q + 7;
            if (strspn(r, BASE64_CHARS_NOEQ) == 43) {
                memmove(key, q, 50); /* 7-char prefix + 43-char base64 */
                key[50] = '\0';
                return true;
            }
        }

        r = q;
        if (strstartswith(r, "MD5:"))
            r += 4;
        if (strlen(r) == 16*3 - 1 &&
            r[strspn(r, "0123456789abcdefABCDEF:")] == 0) {
            /*
             * Test for a valid MD5 key fingerprint. Check the colons
             * are in the right places, and if so, return the same
             * fingerprint canonicalised into lowercase.
             */
            int i;
            for (i = 0; i < 16; i++)
                if (r[3*i] == ':' || r[3*i+1] == ':')
                    goto not_fingerprint; /* sorry */
            for (i = 0; i < 15; i++)
                if (r[3*i+2] != ':')
                    goto not_fingerprint; /* sorry */
            for (i = 0; i < 16*3 - 1; i++)
                key[i] = tolower(r[i]);
            key[16*3 - 1] = '\0';
            return true;
        }
      not_fingerprint:;

        /*
         * Before we check for a public-key blob, trim newlines out of
         * the middle of the word, in case someone's managed to paste
         * in a public-key blob _with_ them.
         */
        for (r = s = q; *r; r++)
            if (*r != '\n' && *r != '\r')
                *s++ = *r;
        *s = '\0';

        if (strlen(q) % 4 == 0 && strlen(q) > 2*4 &&
            q[strspn(q, BASE64_CHARS_ALL)] == 0) {
            /*
             * Might be a base64-encoded SSH-2 public key blob. Check
             * that it starts with a sensible algorithm string. No
             * canonicalisation is necessary for this string type.
             *
             * The algorithm string must be at most 64 characters long
             * (RFC 4251 section 6).
             */
            unsigned char decoded[6];
            unsigned alglen;
            int minlen;
            int len = 0;

            len += base64_decode_atom(q, decoded+len);
            if (len < 3)
                goto not_ssh2_blob;    /* sorry */
            len += base64_decode_atom(q+4, decoded+len);
            if (len < 4)
                goto not_ssh2_blob;    /* sorry */

            alglen = GET_32BIT_MSB_FIRST(decoded);
            if (alglen > 64)
                goto not_ssh2_blob;    /* sorry */

            minlen = ((alglen + 4) + 2) / 3;
            if (strlen(q) < minlen)
                goto not_ssh2_blob;    /* sorry */

            size_t base64_len = strspn(q, BASE64_CHARS_ALL);
            memmove(key, q, base64_len);
            key[base64_len] = '\0';
            return true;
        }
      not_ssh2_blob:;
    }

    return false;
}